

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O2

void dumpFunction(DumpState *D,Proto *f,TString *psource)

{
  TValue *pTVar1;
  uint uVar2;
  int x;
  ulong uVar3;
  ulong uVar4;
  
  if ((D->strip == 0) && (f->source != psource)) {
    dumpString(D,f->source);
  }
  else {
    dumpSize(D,0);
  }
  dumpInt(D,f->linedefined);
  dumpInt(D,f->lastlinedefined);
  dumpByte(D,(uint)f->numparams);
  dumpByte(D,(uint)f->is_vararg);
  dumpByte(D,(uint)f->maxstacksize);
  dumpInt(D,f->sizecode);
  dumpBlock(D,f->code,(long)f->sizecode << 2);
  uVar2 = f->sizek;
  dumpInt(D,uVar2);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    pTVar1 = f->k;
    uVar2 = (&pTVar1->tt_)[uVar3] & 0x3f;
    dumpByte(D,uVar2);
    if (uVar2 == 3) {
      dumpInteger(D,*(lua_Integer *)((long)&pTVar1->value_ + uVar3));
    }
    else if ((uVar2 == 4) || (uVar2 == 0x14)) {
      dumpString(D,*(TString **)((long)&pTVar1->value_ + uVar3));
    }
    else if (uVar2 == 0x13) {
      dumpNumber(D,*(lua_Number *)((long)&pTVar1->value_ + uVar3));
    }
  }
  uVar2 = f->sizeupvalues;
  dumpInt(D,uVar2);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 * 0x10 != uVar3; uVar3 = uVar3 + 0x10) {
    dumpByte(D,(uint)(&f->upvalues->instack)[uVar3]);
    dumpByte(D,(uint)(&f->upvalues->idx)[uVar3]);
    dumpByte(D,(uint)(&f->upvalues->kind)[uVar3]);
  }
  uVar2 = f->sizep;
  dumpInt(D,uVar2);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    dumpFunction(D,f->p[uVar3],f->source);
  }
  uVar2 = 0;
  x = 0;
  if (D->strip == 0) {
    x = f->sizelineinfo;
  }
  dumpInt(D,x);
  dumpBlock(D,f->lineinfo,(long)x);
  if (D->strip == 0) {
    uVar2 = f->sizeabslineinfo;
  }
  dumpInt(D,uVar2);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    dumpInt(D,f->abslineinfo[uVar3].pc);
    dumpInt(D,f->abslineinfo[uVar3].line);
  }
  uVar4 = 0;
  uVar2 = 0;
  if (D->strip == 0) {
    uVar2 = f->sizelocvars;
  }
  dumpInt(D,uVar2);
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    dumpString(D,*(TString **)((long)&f->locvars->varname + uVar4));
    dumpInt(D,*(int *)((long)&f->locvars->startpc + uVar4));
    dumpInt(D,*(int *)((long)&f->locvars->endpc + uVar4));
  }
  uVar4 = 0;
  uVar2 = 0;
  if (D->strip == 0) {
    uVar2 = f->sizeupvalues;
  }
  dumpInt(D,uVar2);
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 * 0x10 != uVar4; uVar4 = uVar4 + 0x10) {
    dumpString(D,*(TString **)((long)&f->upvalues->name + uVar4));
  }
  return;
}

Assistant:

static void dumpFunction (DumpState *D, const Proto *f, TString *psource) {
  if (D->strip || f->source == psource)
    dumpString(D, NULL);  /* no debug info or same source as its parent */
  else
    dumpString(D, f->source);
  dumpInt(D, f->linedefined);
  dumpInt(D, f->lastlinedefined);
  dumpByte(D, f->numparams);
  dumpByte(D, f->is_vararg);
  dumpByte(D, f->maxstacksize);
  dumpCode(D, f);
  dumpConstants(D, f);
  dumpUpvalues(D, f);
  dumpProtos(D, f);
  dumpDebug(D, f);
}